

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall ImgfsFile::markent(ImgfsFile *this,uint64_t ofs,entrytype_t tag)

{
  uint uVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  
  uVar1 = entryofs2index(this,ofs);
  if ((tag != FREEENTRY) &&
     (uVar2 = (uint)(char)(this->_entrymap).
                          super__Vector_base<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar1], uVar2 != 0x20)) {
    printf("entry %08llx (%d) is already %c, marking %c\n",ofs,(ulong)uVar1,(ulong)uVar2,
           CONCAT71(in_register_00000011,tag) & 0xffffffff);
  }
  (this->_entrymap).
  super__Vector_base<ImgfsFile::entrytype_t,_std::allocator<ImgfsFile::entrytype_t>_>._M_impl.
  super__Vector_impl_data._M_start[uVar1] = tag;
  return;
}

Assistant:

void markent(uint64_t ofs, entrytype_t tag)
    {
        unsigned ix= entryofs2index(ofs);
        if (tag!=FREEENTRY && _entrymap[ix]!=FREEENTRY) {
            printf("entry %08llx (%d) is already %c, marking %c\n", ofs, ix, _entrymap[ix], tag);
        }
        _entrymap[ix]= tag;
    }